

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O0

void regex_free(regex_handle *re)

{
  regex_priv *priv;
  regex_handle *re_local;
  
  if (re->priv != (void *)0x0) {
    if (*re->priv != 0) {
      pcre2_code_free_8(*re->priv);
    }
    free(re->priv);
    re->priv = (void *)0x0;
  }
  return;
}

Assistant:

void regex_free(struct regex_handle *re)
{
	if (re->priv != NULL) {
		struct regex_priv *priv = re->priv;

		if (priv->re != NULL)
			pcre2_code_free(priv->re);

		free(re->priv);
		re->priv = NULL;
	}
}